

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_RecGroupIndices_Test::TestBody(IsorecursiveTest_RecGroupIndices_Test *this)

{
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  char *in_R9;
  Entry EVar3;
  AssertHelper local_318;
  Message local_310;
  uint local_304;
  unsigned_long local_300;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_7;
  Message local_2e0;
  uint local_2d4;
  unsigned_long local_2d0;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_6;
  Message local_2b0;
  uint local_2a4;
  unsigned_long local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_5;
  Message local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_4;
  Message local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_3;
  Message local_220;
  uint local_214;
  unsigned_long local_210;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_2;
  Message local_1f0;
  uint local_1e4;
  unsigned_long local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  Message local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_178;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Struct local_108;
  Entry local_e8;
  Struct local_d8;
  Entry local_b8;
  Struct local_a8;
  Entry local_88;
  Struct local_78;
  Entry local_58;
  Struct local_48 [2];
  TypeBuilder local_18;
  TypeBuilder builder;
  IsorecursiveTest_RecGroupIndices_Test *this_local;
  
  builder.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  wasm::TypeBuilder::TypeBuilder(&local_18,5);
  wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(local_48);
  local_58 = wasm::TypeBuilder::operator[](&local_18,0);
  wasm::TypeBuilder::Entry::operator=(&local_58,local_48);
  wasm::Struct::~Struct(local_48);
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_78);
  local_88 = wasm::TypeBuilder::operator[](&local_18,1);
  wasm::TypeBuilder::Entry::operator=(&local_88,&local_78);
  wasm::Struct::~Struct(&local_78);
  wasm::TypeBuilder::createRecGroup((ulong)&local_18,2);
  local_a8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_a8);
  local_b8 = wasm::TypeBuilder::operator[](&local_18,2);
  wasm::TypeBuilder::Entry::operator=(&local_b8,&local_a8);
  wasm::Struct::~Struct(&local_a8);
  local_d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_d8);
  local_e8 = wasm::TypeBuilder::operator[](&local_18,3);
  wasm::TypeBuilder::Entry::operator=(&local_e8,&local_d8);
  wasm::Struct::~Struct(&local_d8);
  local_108.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_108);
  EVar3 = wasm::TypeBuilder::operator[](&local_18,4);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar3.builder;
  wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_108);
  wasm::Struct::~Struct(&local_108);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_148,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_148,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (bVar1) {
    __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,0);
    local_1b0 = wasm::HeapType::getRecGroup();
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,1);
    local_1b8 = wasm::HeapType::getRecGroup();
    testing::internal::EqHelper::Compare<wasm::RecGroup,_wasm::RecGroup,_nullptr>
              ((EqHelper *)local_1a8,"built[0].getRecGroup()","built[1].getRecGroup()",
               (RecGroup *)&local_1b0,(RecGroup *)&local_1b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x13c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,0);
    local_1e0 = wasm::HeapType::getRecGroupIndex();
    local_1e4 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_1d8,"built[0].getRecGroupIndex()","0u",&local_1e0,&local_1e4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x13d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,1);
    local_210 = wasm::HeapType::getRecGroupIndex();
    local_214 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_208,"built[1].getRecGroupIndex()","1u",&local_210,&local_214);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x13e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_220);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,2);
    local_240 = wasm::HeapType::getRecGroup();
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,3);
    local_248 = wasm::HeapType::getRecGroup();
    testing::internal::EqHelper::Compare<wasm::RecGroup,_wasm::RecGroup,_nullptr>
              ((EqHelper *)local_238,"built[2].getRecGroup()","built[3].getRecGroup()",
               (RecGroup *)&local_240,(RecGroup *)&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x140,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_250);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,3);
    local_270 = wasm::HeapType::getRecGroup();
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,4);
    local_278 = wasm::HeapType::getRecGroup();
    testing::internal::EqHelper::Compare<wasm::RecGroup,_wasm::RecGroup,_nullptr>
              ((EqHelper *)local_268,"built[3].getRecGroup()","built[4].getRecGroup()",
               (RecGroup *)&local_270,(RecGroup *)&local_278);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_280);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x141,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_280);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_280);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,2);
    local_2a0 = wasm::HeapType::getRecGroupIndex();
    local_2a4 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_298,"built[2].getRecGroupIndex()","0u",&local_2a0,&local_2a4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
    if (!bVar1) {
      testing::Message::Message(&local_2b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x142,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_2b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,3);
    local_2d0 = wasm::HeapType::getRecGroupIndex();
    local_2d4 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_2c8,"built[3].getRecGroupIndex()","1u",&local_2d0,&local_2d4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
    if (!bVar1) {
      testing::Message::Message(&local_2e0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x143,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_2e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,4);
    local_300 = wasm::HeapType::getRecGroupIndex();
    local_304 = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_2f8,"built[4].getRecGroupIndex()","2u",&local_300,&local_304);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
      testing::internal::AssertHelper::AssertHelper
                (&local_318,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x144,pcVar2);
      testing::internal::AssertHelper::operator=(&local_318,&local_310);
      testing::internal::AssertHelper::~AssertHelper(&local_318);
      testing::Message::~Message(&local_310);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, RecGroupIndices) {
  TypeBuilder builder(5);

  builder.createRecGroup(0, 2);
  builder[0] = Struct{};
  builder[1] = Struct{};

  builder.createRecGroup(2, 3);
  builder[2] = Struct{};
  builder[3] = Struct{};
  builder[4] = Struct{};

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0].getRecGroup(), built[1].getRecGroup());
  EXPECT_EQ(built[0].getRecGroupIndex(), 0u);
  EXPECT_EQ(built[1].getRecGroupIndex(), 1u);

  EXPECT_EQ(built[2].getRecGroup(), built[3].getRecGroup());
  EXPECT_EQ(built[3].getRecGroup(), built[4].getRecGroup());
  EXPECT_EQ(built[2].getRecGroupIndex(), 0u);
  EXPECT_EQ(built[3].getRecGroupIndex(), 1u);
  EXPECT_EQ(built[4].getRecGroupIndex(), 2u);
}